

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O3

bool __thiscall QJsonObject::contains(QJsonObject *this,QLatin1StringView key)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  bool keyExists;
  bool local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->o).d.ptr == (QCborContainerPrivate *)0x0) {
    uVar1 = 0;
  }
  else {
    local_11 = true;
    indexOf<QLatin1String>(&this->o,key,&local_11);
    uVar1 = local_11;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QJsonObject::contains(QLatin1StringView key) const
{
    return containsImpl(key);
}